

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

void Extra_TruthCountOnesInCofs(uint *pTruth,int nVars,short *pStore)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  short *psVar16;
  uint uVar17;
  short *psVar18;
  uint local_60;
  
  uVar5 = 1 << ((char)nVars - 5U & 0x1f);
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 6) {
    if (0 < nVars) {
      uVar5 = *pTruth;
      uVar9 = (uVar5 >> 2 & 0x11111111) + (uVar5 & 0x11111111);
      uVar9 = (uVar9 >> 4 & 0x3030303) + (uVar9 & 0x3030303);
      iVar10 = (uVar9 >> 8 & 0x70007) + (uVar9 & 0x70007);
      *pStore = (short)((uint)iVar10 >> 0x10) + (short)iVar10;
      uVar5 = (uVar5 >> 3 & 0x11111111) + (uVar5 >> 1 & 0x11111111);
      uVar5 = (uVar5 >> 4 & 0x3030303) + (uVar5 & 0x3030303);
      iVar10 = (uVar5 >> 8 & 0x70007) + (uVar5 & 0x70007);
      pStore[1] = (short)((uint)iVar10 >> 0x10) + (short)iVar10;
    }
    if (1 < nVars) {
      uVar5 = *pTruth;
      uVar9 = (uVar5 >> 1 & 0x11111111) + (uVar5 & 0x11111111);
      uVar9 = (uVar9 >> 4 & 0x3030303) + (uVar9 & 0x3030303);
      iVar10 = (uVar9 >> 8 & 0x70007) + (uVar9 & 0x70007);
      pStore[2] = (short)((uint)iVar10 >> 0x10) + (short)iVar10;
      uVar5 = (uVar5 >> 1 & 0x44444444) + (uVar5 & 0x44444444);
      uVar5 = (uVar5 >> 6 & 0x3030303) + (uVar5 >> 2 & 0x3030303);
      iVar10 = (uVar5 >> 8 & 0x70007) + (uVar5 & 0x70007);
      pStore[3] = (short)((uint)iVar10 >> 0x10) + (short)iVar10;
    }
    if (2 < nVars) {
      uVar5 = *pTruth;
      uVar9 = (uVar5 >> 1 & 0x5050505) + (uVar5 & 0x5050505);
      uVar9 = (uVar9 >> 2 & 0x3030303) + (uVar9 & 0x3030303);
      iVar10 = (uVar9 >> 8 & 0x70007) + (uVar9 & 0x70007);
      pStore[4] = (short)((uint)iVar10 >> 0x10) + (short)iVar10;
      uVar5 = (uVar5 >> 1 & 0x50505050) + (uVar5 & 0x50505050);
      uVar5 = (uVar5 >> 2 & 0x30303030) + (uVar5 & 0x30303030);
      iVar10 = (uVar5 >> 0xc & 0x70007) + (uVar5 >> 4 & 0x70007);
      pStore[5] = (short)((uint)iVar10 >> 0x10) + (short)iVar10;
    }
    if (3 < nVars) {
      uVar5 = *pTruth;
      uVar9 = (uVar5 >> 1 & 0x550055) + (uVar5 & 0x550055);
      uVar9 = (uVar9 >> 2 & 0x330033) + (uVar9 & 0x330033);
      iVar10 = (uVar9 >> 4 & 0x70007) + (uVar9 & 0x70007);
      pStore[6] = (short)((uint)iVar10 >> 0x10) + (short)iVar10;
      uVar5 = (uVar5 >> 1 & 0x55005500) + (uVar5 & 0x55005500);
      uVar5 = (uVar5 >> 2 & 0x33003300) + (uVar5 & 0x33003300);
      iVar10 = (uVar5 >> 4 & 0x7000700) + (uVar5 & 0x7000700);
      pStore[7] = (ushort)(byte)((uint)iVar10 >> 0x18) + (short)((uint)iVar10 >> 8);
    }
    if (nVars == 5) {
      uVar5 = *pTruth;
      uVar9 = (uVar5 >> 1 & 0x5555) + (uVar5 & 0x5555);
      uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333);
      iVar10 = (uVar9 >> 4 & 0x707) + (uVar9 & 0x707);
      pStore[8] = (short)((uint)iVar10 >> 8) + ((ushort)iVar10 & 0xff);
      uVar5 = (uVar5 >> 1 & 0x55550000) + (uVar5 & 0x55550000);
      uVar5 = (uVar5 >> 2 & 0x33330000) + (uVar5 & 0x33330000);
      uVar5 = (uVar5 >> 4 & 0x7070000) + (uVar5 & 0x7070000);
      pStore[9] = (short)((uVar5 >> 8) + (uVar5 & 0xf0000) >> 0x10);
    }
  }
  else {
    if (0 < (int)uVar5) {
      uVar8 = 0;
      do {
        uVar9 = (pTruth[uVar8] & 0x55555555) + (pTruth[uVar8] >> 1 & 0x55555555);
        uVar9 = (uVar9 & 0x33333333) + (uVar9 >> 2 & 0x33333333);
        uVar9 = (uVar9 & 0x7070707) + (uVar9 >> 4 & 0x7070707);
        iVar10 = (uVar9 & 0xf000f) + (uVar9 >> 8 & 0xf000f);
        lVar14 = 0;
        psVar16 = pStore + 10;
        do {
          psVar18 = psVar16 + 1;
          if (((uint)uVar8 >> ((uint)lVar14 & 0x1f) & 1) == 0) {
            psVar18 = psVar16;
          }
          *psVar18 = *psVar18 + (short)((uint)iVar10 >> 0x10) + (short)iVar10;
          psVar16 = psVar16 + 2;
          lVar14 = lVar14 + 1;
        } while ((ulong)(uint)nVars - 5 != lVar14);
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar5);
    }
    if (1 < (int)uVar5) {
      uVar12 = (uint)(ushort)*pStore;
      uVar3 = (uint)(ushort)pStore[1];
      uVar17 = (uint)(ushort)pStore[2];
      uVar9 = (uint)(ushort)pStore[3];
      uVar7 = (uint)(ushort)pStore[4];
      uVar15 = (uint)(ushort)pStore[5];
      uVar6 = (uint)(ushort)pStore[6];
      local_60 = (uint)(ushort)pStore[7];
      uVar4 = (uint)(ushort)pStore[8];
      uVar13 = (uint)(ushort)pStore[9];
      lVar14 = 0;
      do {
        uVar1 = pTruth[lVar14 * 2];
        uVar2 = pTruth[lVar14 * 2 + 1];
        uVar11 = (uVar2 & 0x55555555) + (uVar1 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar12 = (uVar11 >> 0x10) + uVar12 + uVar11;
        uVar11 = (uVar1 >> 1 & 0x55555555) + (uVar2 >> 1 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar3 = (uVar11 >> 0x10) + uVar3 + uVar11;
        uVar11 = (uVar1 & 0x33333333) + (uVar2 & 0xf3333333) * 4;
        uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar17 = (uVar11 >> 0x10) + uVar17 + uVar11;
        uVar11 = uVar2 >> 2 & 0x33333333 | uVar1 & 0xcccccccc;
        uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar9 = (uVar11 >> 0x10) + uVar9 + uVar11;
        uVar11 = (uVar2 & 0xf0f0f0f) << 4 | uVar1 & 0xf0f0f0f;
        uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar7 = (uVar11 >> 0x10) + uVar7 + uVar11;
        uVar11 = uVar2 >> 4 & 0xf0f0f0f | uVar1 & 0xf0f0f0f0;
        uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar15 = (uVar11 >> 0x10) + uVar15 + uVar11;
        uVar11 = (uVar2 & 0xff00ff) << 8 | uVar1 & 0xff00ff;
        uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar6 = (uVar11 >> 0x10) + uVar6 + uVar11;
        uVar11 = uVar2 >> 8 & 0xff00ff | uVar1 & 0xff00ff00;
        uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        local_60 = (uVar11 >> 0x10) + local_60 + uVar11;
        uVar11 = uVar2 << 0x10 | uVar1 & 0xffff;
        uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar4 = (uVar11 >> 0x10) + uVar4 + uVar11;
        uVar11 = uVar2 >> 0x10 | uVar1 & 0xffff0000;
        uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
        uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
        uVar13 = (uVar11 >> 0x10) + uVar13 + uVar11;
        lVar14 = lVar14 + 1;
      } while ((int)uVar5 / 2 != (int)lVar14);
      *pStore = (short)uVar12;
      pStore[1] = (short)uVar3;
      pStore[2] = (short)uVar17;
      pStore[3] = (short)uVar9;
      pStore[4] = (short)uVar7;
      pStore[5] = (short)uVar15;
      pStore[6] = (short)uVar6;
      pStore[7] = (short)local_60;
      pStore[8] = (short)uVar4;
      pStore[9] = (short)uVar13;
    }
  }
  return;
}

Assistant:

void Extra_TruthCountOnesInCofs( unsigned * pTruth, int nVars, short * pStore )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(short) * 2 * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
        {
            pStore[2*0+0] = Extra_WordCountOnes( pTruth[0] & 0x55555555 );
            pStore[2*0+1] = Extra_WordCountOnes( pTruth[0] & 0xAAAAAAAA );
        }
        if ( nVars > 1 )
        {
            pStore[2*1+0] = Extra_WordCountOnes( pTruth[0] & 0x33333333 );
            pStore[2*1+1] = Extra_WordCountOnes( pTruth[0] & 0xCCCCCCCC );
        }
        if ( nVars > 2 )
        {
            pStore[2*2+0] = Extra_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
            pStore[2*2+1] = Extra_WordCountOnes( pTruth[0] & 0xF0F0F0F0 );
        }
        if ( nVars > 3 )
        {
            pStore[2*3+0] = Extra_WordCountOnes( pTruth[0] & 0x00FF00FF );
            pStore[2*3+1] = Extra_WordCountOnes( pTruth[0] & 0xFF00FF00 );
        }
        if ( nVars > 4 )
        {
            pStore[2*4+0] = Extra_WordCountOnes( pTruth[0] & 0x0000FFFF );
            pStore[2*4+1] = Extra_WordCountOnes( pTruth[0] & 0xFFFF0000 );
        }
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Extra_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( k & (1 << (i-5)) )
                pStore[2*i+1] += Counter;
            else
                pStore[2*i+0] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[2*0+0] += Extra_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[2*0+1] += Extra_WordCountOnes( (pTruth[0] & 0xAAAAAAAA) | ((pTruth[1] & 0xAAAAAAAA) >>  1) );
        pStore[2*1+0] += Extra_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2*1+1] += Extra_WordCountOnes( (pTruth[0] & 0xCCCCCCCC) | ((pTruth[1] & 0xCCCCCCCC) >>  2) );
        pStore[2*2+0] += Extra_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[2*2+1] += Extra_WordCountOnes( (pTruth[0] & 0xF0F0F0F0) | ((pTruth[1] & 0xF0F0F0F0) >>  4) );
        pStore[2*3+0] += Extra_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[2*3+1] += Extra_WordCountOnes( (pTruth[0] & 0xFF00FF00) | ((pTruth[1] & 0xFF00FF00) >>  8) );
        pStore[2*4+0] += Extra_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pStore[2*4+1] += Extra_WordCountOnes( (pTruth[0] & 0xFFFF0000) | ((pTruth[1] & 0xFFFF0000) >> 16) );
        pTruth += 2;
    }
}